

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<const_chaiscript::Boxed_Number_(const_chaiscript::Boxed_Number_&,_const_chaiscript::Boxed_Number_&),_const_chaiscript::Boxed_Number_(*)(const_chaiscript::Boxed_Number_&,_const_chaiscript::Boxed_Number_&)>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<const_chaiscript::Boxed_Number_(const_chaiscript::Boxed_Number_&,_const_chaiscript::Boxed_Number_&),_const_chaiscript::Boxed_Number_(*)(const_chaiscript::Boxed_Number_&,_const_chaiscript::Boxed_Number_&)>
           *this,_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *f)

{
  _func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *in_RDX;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  _func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *local_18;
  _func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *f_local;
  Proxy_Function_Callable_Impl<const_chaiscript::Boxed_Number_(const_chaiscript::Boxed_Number_&,_const_chaiscript::Boxed_Number_&),_const_chaiscript::Boxed_Number_(*)(const_chaiscript::Boxed_Number_&,_const_chaiscript::Boxed_Number_&)>
  *this_local;
  
  local_18 = f;
  f_local = (_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *)this;
  detail::
  build_param_type_list<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            (&local_30,(detail *)0x0,in_RDX);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (&this->super_Proxy_Function_Impl_Base,&local_30);
  Catch::clara::std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
            (&local_30);
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Callable_Impl_00d5e628;
  this->m_f = local_18;
  return;
}

Assistant:

explicit Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr)))
          , m_f(std::move(f)) {
      }